

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::LoadObj(attrib_t *attrib,
                     vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     string *err,istream *inStream,MaterialReader *readMatFn,bool triangulate)

{
  pointer *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  size_t sVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  reference this_01;
  mapped_type *pmVar10;
  reference pvVar11;
  char *pcVar12;
  reference pvVar13;
  reference pvVar14;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **token_00;
  char **extraout_RDX_01;
  char **ppcVar15;
  char **extraout_RDX_02;
  real_t rVar16;
  tag_sizes tVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  undefined1 local_a11;
  undefined1 local_a10 [7];
  bool ret;
  ulong local_9f0;
  size_t i_2;
  size_t i_1;
  size_t i;
  int local_9d0;
  undefined8 local_9c8;
  tag_sizes ts;
  undefined1 local_998 [8];
  tag_t tag;
  stringstream local_910 [8];
  stringstream ss_1;
  ostream local_900 [376];
  anon_struct_128_2_9bb102e5 local_788;
  undefined1 local_701;
  undefined1 local_700 [7];
  bool ret_2;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  allocator<char> local_639;
  string local_638 [6];
  bool ret_1;
  byte local_611;
  undefined1 local_610 [7];
  bool ok;
  string err_mtl;
  size_t s;
  undefined1 local_5e0 [6];
  bool found;
  undefined1 local_5c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  _Self local_5a0;
  int local_594;
  undefined1 local_590 [4];
  int newMaterialId;
  string namebuf;
  stringstream ss;
  ostream local_560 [376];
  vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> local_3e8;
  size_t local_3d0;
  size_t n;
  vertex_index vi;
  vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> face;
  real_t local_398;
  real_t y_2;
  real_t x_2;
  real_t z_1;
  real_t y_1;
  real_t x_1;
  real_t b;
  real_t g;
  real_t r;
  real_t z;
  real_t y;
  real_t x;
  char *token;
  undefined1 local_358 [8];
  string linebuf;
  shape_t shape;
  undefined1 local_2b0 [4];
  int material;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  string name;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  faceGroup;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> tags;
  vector<float,_std::allocator<float>_> vc;
  vector<float,_std::allocator<float>_> vt;
  vector<float,_std::allocator<float>_> vn;
  vector<float,_std::allocator<float>_> v;
  stringstream errss;
  bool triangulate_local;
  MaterialReader *readMatFn_local;
  istream *inStream_local;
  string *err_local;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials_local;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes_local;
  attrib_t *attrib_local;
  
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &vn.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &vt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &vc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::vector
            ((vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
             &faceGroup.
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ::vector((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
            *)((long)&name.field_2 + 8));
  std::__cxx11::string::string
            ((string *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)local_2b0);
  shape.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  anon_struct_128_2_9bb102e5::shape_t((anon_struct_128_2_9bb102e5 *)((long)&linebuf.field_2 + 8));
  std::__cxx11::string::string((string *)local_358);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            do {
              do {
                iVar3 = std::istream::peek();
                if (iVar3 == -1) {
                  local_a11 = exportFaceGroupToShape
                                        ((shape_t *)((long)&linebuf.field_2 + 8),
                                         (vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                                          *)((long)&name.field_2 + 8),
                                         (vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                                         &faceGroup.
                                          super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         shape.mesh.tags.
                                         super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         (string *)
                                         &material_map._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,triangulate);
                  if (((bool)local_a11) ||
                     (sVar9 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                          *)((long)&shape.name.field_2 + 8)), sVar9 != 0)) {
                    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                              (shapes,(value_type *)((long)&linebuf.field_2 + 8));
                  }
                  std::
                  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                  ::clear((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                           *)((long)&name.field_2 + 8));
                  if (err != (string *)0x0) {
                    std::__cxx11::stringstream::str();
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator+=(err,&local_a38);
                    std::__cxx11::string::~string((string *)&local_a38);
                  }
                  std::vector<float,_std::allocator<float>_>::swap
                            (&attrib->vertices,
                             (vector<float,_std::allocator<float>_> *)
                             &vn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
                  std::vector<float,_std::allocator<float>_>::swap
                            (&attrib->normals,
                             (vector<float,_std::allocator<float>_> *)
                             &vt.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
                  std::vector<float,_std::allocator<float>_>::swap
                            (&attrib->texcoords,
                             (vector<float,_std::allocator<float>_> *)
                             &vc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
                  std::vector<float,_std::allocator<float>_>::swap
                            (&attrib->colors,
                             (vector<float,_std::allocator<float>_> *)
                             &tags.
                              super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
                  attrib_local._7_1_ = 1;
                  n._0_4_ = 1;
                  goto LAB_0013a7de;
                }
                safeGetline(inStream,(string *)local_358);
                sVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_358);
                if (sVar4 != 0) {
                  sVar4 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_358);
                  pvVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_358,sVar4 - 1);
                  if (*pvVar5 == '\n') {
                    sVar4 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_358);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_358,sVar4 - 1,0xffffffffffffffff);
                  }
                }
                sVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_358);
                if (sVar4 != 0) {
                  sVar4 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_358);
                  pvVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_358,sVar4 - 1);
                  if (*pvVar5 == '\r') {
                    sVar4 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_358);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_358,sVar4 - 1,0xffffffffffffffff);
                  }
                }
                bVar2 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_358);
              } while (bVar2);
              _y = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_358);
              sVar6 = strspn(_y," \t");
              _y = _y + sVar6;
              if (_y == (char *)0x0) {
                __assert_fail("token",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/tinyobjloader/tiny_obj_loader.h"
                              ,0x620,
                              "bool tinyobj::LoadObj(attrib_t *, std::vector<shape_t> *, std::vector<material_t> *, std::string *, std::istream *, MaterialReader *, bool)"
                             );
              }
            } while ((*_y == '\0') || (*_y == '#'));
            if ((*_y != 'v') || ((_y[1] != ' ' && (_y[1] != '\t')))) break;
            _y = _y + 2;
            parseVertexWithColor(&z,&r,&g,&b,&x_1,&y_1,(char **)&y,0.0,0.0,0.0);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)
                       &vn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&z);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)
                       &vn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&r);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)
                       &vn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&g);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)
                       &tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,&b);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)
                       &tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,&x_1);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)
                       &tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,&y_1);
          }
          if ((*_y != 'v') || ((_y[1] != 'n' || ((_y[2] != ' ' && (_y[2] != '\t')))))) break;
          _y = _y + 3;
          parseReal3(&z_1,&x_2,&y_2,(char **)&y,0.0,0.0,0.0);
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     &vt.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&z_1);
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     &vt.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&x_2);
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     &vt.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&y_2);
        }
        if ((*_y != 'v') || ((_y[1] != 't' || ((_y[2] != ' ' && (_y[2] != '\t')))))) break;
        _y = _y + 3;
        parseReal2(&local_398,
                   (real_t *)
                   ((long)&face.
                           super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),(char **)&y,0.0,
                   0.0);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &vc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_398);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &vc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict4 *)
                   ((long)&face.
                           super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      if ((*_y == 'f') && ((_y[1] == ' ' || (_y[1] == '\t')))) break;
      iVar3 = strncmp(_y,"usemtl",6);
      if ((iVar3 == 0) && ((_y[6] == ' ' || (_y[6] == '\t')))) {
        _y = _y + 7;
        std::__cxx11::stringstream::stringstream((stringstream *)(namebuf.field_2._M_local_buf + 8))
        ;
        std::operator<<(local_560,_y);
        std::__cxx11::stringstream::str();
        local_594 = -1;
        local_5a0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)local_2b0,(key_type *)local_590);
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_2b0);
        bVar2 = std::operator==(&local_5a0,
                                (_Self *)&filenames.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)local_2b0,(key_type *)local_590);
          local_594 = *pmVar10;
        }
        if (local_594 !=
            shape.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
          exportFaceGroupToShape
                    ((shape_t *)((long)&linebuf.field_2 + 8),
                     (vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                      *)((long)&name.field_2 + 8),
                     (vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                     &faceGroup.
                      super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     shape.mesh.tags.
                     super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (string *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     triangulate);
          std::
          vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
          ::clear((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                   *)((long)&name.field_2 + 8));
          shape.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_594;
        }
        n._0_4_ = 2;
        std::__cxx11::string::~string((string *)local_590);
        std::__cxx11::stringstream::~stringstream
                  ((stringstream *)(namebuf.field_2._M_local_buf + 8));
      }
      else {
        iVar3 = strncmp(_y,"mtllib",6);
        if ((iVar3 == 0) && ((_y[6] == ' ' || (_y[6] == '\t')))) {
          if (readMatFn != (MaterialReader *)0x0) {
            _y = _y + 7;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5c0);
            pcVar12 = _y;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_5e0,pcVar12,(allocator<char> *)((long)&s + 7));
            SplitString((string *)local_5e0,' ',
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_5c0);
            std::__cxx11::string::~string((string *)local_5e0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
            bVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5c0);
            if (bVar2) {
              if (err != (string *)0x0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=(err,
                           "WARN: Looks like empty filename for mtllib. Use default material. \n");
              }
            }
            else {
              s._6_1_ = 0;
              for (err_mtl.field_2._8_8_ = 0; uVar1 = err_mtl.field_2._8_8_,
                  sVar9 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_5c0), (ulong)uVar1 < sVar9;
                  err_mtl.field_2._8_8_ = err_mtl.field_2._8_8_ + 1) {
                std::__cxx11::string::string((string *)local_610);
                pvVar11 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_5c0,err_mtl.field_2._8_8_);
                pcVar12 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                    (pvVar11);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>(local_638,pcVar12,&local_639);
                iVar3 = (*readMatFn->_vptr_MaterialReader[2])
                                  (readMatFn,local_638,materials,local_2b0,local_610);
                std::__cxx11::string::~string(local_638);
                std::allocator<char>::~allocator(&local_639);
                local_611 = (byte)iVar3 & 1;
                if ((err != (string *)0x0) &&
                   (bVar2 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_610), !bVar2)) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator+=(err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_610);
                }
                if ((local_611 & 1) == 0) {
                  n._0_4_ = 0;
                }
                else {
                  s._6_1_ = 1;
                  n._0_4_ = 6;
                }
                std::__cxx11::string::~string((string *)local_610);
                if ((int)n != 0) break;
              }
              if (((s._6_1_ & 1) == 0) && (err != (string *)0x0)) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=(err,"WARN: Failed to load material file(s). Use default material.\n");
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_5c0);
          }
        }
        else if ((*_y == 'g') && ((_y[1] == ' ' || (_y[1] == '\t')))) {
          exportFaceGroupToShape
                    ((shape_t *)((long)&linebuf.field_2 + 8),
                     (vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                      *)((long)&name.field_2 + 8),
                     (vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                     &faceGroup.
                      super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     shape.mesh.tags.
                     super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (string *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     triangulate);
          sVar9 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                            ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                             ((long)&shape.name.field_2 + 8));
          if (sVar9 != 0) {
            std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                      (shapes,(value_type *)((long)&linebuf.field_2 + 8));
          }
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this = &names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
          anon_struct_128_2_9bb102e5::shape_t((anon_struct_128_2_9bb102e5 *)this);
          anon_struct_128_2_9bb102e5::operator=
                    ((anon_struct_128_2_9bb102e5 *)((long)&linebuf.field_2 + 8),
                     (anon_struct_128_2_9bb102e5 *)this);
          anon_struct_128_2_9bb102e5::~shape_t((anon_struct_128_2_9bb102e5 *)this);
          std::
          vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
          ::clear((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                   *)((long)&name.field_2 + 8));
          this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&str.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve(this_00,2);
          ppcVar15 = extraout_RDX;
          while( true ) {
            bVar2 = true;
            if ((*_y != '\r') && (bVar2 = true, *_y != '\n')) {
              bVar2 = *_y == '\0';
            }
            if (bVar2) break;
            parseString_abi_cxx11_((string *)local_700,(tinyobj *)&y,ppcVar15);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&str.field_2 + 8),(value_type *)local_700);
            sVar6 = strspn(_y," \t\r");
            _y = _y + sVar6;
            std::__cxx11::string::~string((string *)local_700);
            ppcVar15 = extraout_RDX_00;
          }
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&str.field_2 + 8));
          if (sVar9 == 0) {
            __assert_fail("names.size() > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/tinyobjloader/tiny_obj_loader.h"
                          ,0x6c8,
                          "bool tinyobj::LoadObj(attrib_t *, std::vector<shape_t> *, std::vector<material_t> *, std::string *, std::istream *, MaterialReader *, bool)"
                         );
          }
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&str.field_2 + 8));
          if (sVar9 < 2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,"");
          }
          else {
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&str.field_2 + 8),1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar11);
          }
          n._0_4_ = 2;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&str.field_2 + 8));
        }
        else if ((*_y == 'o') && ((_y[1] == ' ' || (_y[1] == '\t')))) {
          local_701 = exportFaceGroupToShape
                                ((shape_t *)((long)&linebuf.field_2 + 8),
                                 (vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                                  *)((long)&name.field_2 + 8),
                                 (vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                                 &faceGroup.
                                  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 shape.mesh.tags.
                                 super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 (string *)
                                 &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 triangulate);
          if ((bool)local_701) {
            std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                      (shapes,(value_type *)((long)&linebuf.field_2 + 8));
          }
          std::
          vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
          ::clear((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                   *)((long)&name.field_2 + 8));
          local_788.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_788.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_788.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_788.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_788.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_788.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_788.mesh.num_face_vertices.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_788.mesh.num_face_vertices.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_788.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_788.mesh.num_face_vertices.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_788.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_788.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_788.name.field_2._M_allocated_capacity = 0;
          local_788.name.field_2._8_8_ = 0;
          local_788.name._M_dataplus._M_p = (pointer)0x0;
          local_788.name._M_string_length = 0;
          anon_struct_128_2_9bb102e5::shape_t(&local_788);
          anon_struct_128_2_9bb102e5::operator=
                    ((anon_struct_128_2_9bb102e5 *)((long)&linebuf.field_2 + 8),&local_788);
          anon_struct_128_2_9bb102e5::~shape_t(&local_788);
          _y = _y + 2;
          std::__cxx11::stringstream::stringstream(local_910);
          std::operator<<(local_900,_y);
          std::__cxx11::stringstream::str();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &tag.stringValues.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &tag.stringValues.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          n._0_4_ = 2;
          std::__cxx11::stringstream::~stringstream(local_910);
        }
        else if ((*_y == 't') && ((_y[1] == ' ' || (_y[1] == '\t')))) {
          anon_struct_104_4_4d5e477a::tag_t((anon_struct_104_4_4d5e477a *)local_998);
          _y = _y + 2;
          parseString_abi_cxx11_((string *)&ts.num_strings,(tinyobj *)&y,token_00);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_998,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ts.num_strings);
          std::__cxx11::string::~string((string *)&ts.num_strings);
          tVar17 = parseTagTriple((char **)&y);
          local_9d0 = tVar17.num_strings;
          i = tVar17._0_8_;
          local_9c8._0_4_ = tVar17.num_ints;
          sVar9 = (size_type)(int)local_9c8;
          local_9c8 = i;
          ts.num_ints = local_9d0;
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)((long)&tag.name.field_2 + 8),sVar9);
          for (i_1 = 0; i_1 < (ulong)(long)(int)local_9c8; i_1 = i_1 + 1) {
            iVar3 = parseInt((char **)&y);
            pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)((long)&tag.name.field_2 + 8),
                                 i_1);
            *pvVar13 = iVar3;
          }
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)
                     &tag.intValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(long)local_9c8._4_4_);
          for (i_2 = 0; i_2 < (ulong)(long)local_9c8._4_4_; i_2 = i_2 + 1) {
            rVar16 = parseReal((char **)&y,0.0);
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)
                                 &tag.intValues.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,i_2);
            *pvVar14 = rVar16;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tag.floatValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)ts.num_ints);
          ppcVar15 = extraout_RDX_01;
          for (local_9f0 = 0; local_9f0 < (ulong)(long)ts.num_ints; local_9f0 = local_9f0 + 1) {
            parseString_abi_cxx11_((string *)local_a10,(tinyobj *)&y,ppcVar15);
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&tag.floatValues.
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage,local_9f0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(pvVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a10);
            std::__cxx11::string::~string((string *)local_a10);
            ppcVar15 = extraout_RDX_02;
          }
          std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::push_back
                    ((vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                     &faceGroup.
                      super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_998);
          anon_struct_104_4_4d5e477a::~tag_t((anon_struct_104_4_4d5e477a *)local_998);
        }
      }
    }
    _y = _y + 2;
    sVar6 = strspn(_y," \t");
    _y = _y + sVar6;
    std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::vector
              ((vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)&vi.vt_idx);
    std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::reserve
              ((vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)&vi.vt_idx,3
              );
    while( true ) {
      bVar2 = true;
      if ((*_y != '\r') && (bVar2 = true, *_y != '\n')) {
        bVar2 = *_y == '\0';
      }
      if (bVar2) {
        local_3e8.super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3e8.super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3e8.super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::vector
                  (&local_3e8);
        std::
        vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
        ::push_back((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                     *)((long)&name.field_2 + 8),&local_3e8);
        std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::~vector
                  (&local_3e8);
        sVar9 = std::
                vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                ::size((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                        *)((long)&name.field_2 + 8));
        this_01 = std::
                  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                  ::operator[]((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                                *)((long)&name.field_2 + 8),sVar9 - 1);
        std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::swap
                  (this_01,(vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)
                           &vi.vt_idx);
        n._0_4_ = 2;
        goto LAB_0013998c;
      }
      vertex_index::vertex_index((vertex_index *)((long)&n + 4));
      sVar9 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)
                         &vn.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      sVar7 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)
                         &vt.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      sVar8 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)
                         &vc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      bVar2 = parseTriple((char **)&y,(int)(sVar9 / 3),(int)(sVar7 / 3),(int)(sVar8 >> 1),
                          (vertex_index *)((long)&n + 4));
      if (!bVar2) break;
      std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::push_back
                ((vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)&vi.vt_idx
                 ,(value_type *)((long)&n + 4));
      local_3d0 = strspn(_y," \t\r");
      _y = _y + local_3d0;
    }
    if (err != (string *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (err,"Failed parse `f\' line(e.g. zero value for face index).\n");
    }
    attrib_local._7_1_ = 0;
    n._0_4_ = 1;
LAB_0013998c:
    std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::~vector
              ((vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)&vi.vt_idx);
  } while ((int)n == 2);
LAB_0013a7de:
  std::__cxx11::string::~string((string *)local_358);
  anon_struct_128_2_9bb102e5::~shape_t((anon_struct_128_2_9bb102e5 *)((long)&linebuf.field_2 + 8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)local_2b0);
  std::__cxx11::string::~string
            ((string *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ::~vector((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
             *)((long)&name.field_2 + 8));
  std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector
            ((vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
             &faceGroup.
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &vc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &vt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &vn.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return (bool)(attrib_local._7_1_ & 1);
}

Assistant:

bool LoadObj(attrib_t *attrib, std::vector<shape_t> *shapes,
             std::vector<material_t> *materials, std::string *err,
             std::istream *inStream, MaterialReader *readMatFn /*= NULL*/,
             bool triangulate) {
  std::stringstream errss;

  std::vector<real_t> v;
  std::vector<real_t> vn;
  std::vector<real_t> vt;
  std::vector<real_t> vc;
  std::vector<tag_t> tags;
  std::vector<std::vector<vertex_index> > faceGroup;
  std::string name;

  // material
  std::map<std::string, int> material_map;
  int material = -1;

  shape_t shape;

  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      real_t x, y, z;
      real_t r, g, b;
      parseVertexWithColor(&x, &y, &z, &r, &g, &b, &token);
      v.push_back(x);
      v.push_back(y);
      v.push_back(z);

      vc.push_back(r);
      vc.push_back(g);
      vc.push_back(b);
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      vn.push_back(x);
      vn.push_back(y);
      vn.push_back(z);
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y;
      parseReal2(&x, &y, &token);
      vt.push_back(x);
      vt.push_back(y);
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      std::vector<vertex_index> face;
      face.reserve(3);

      while (!IS_NEW_LINE(token[0])) {
        vertex_index vi;
        if (!parseTriple(&token, static_cast<int>(v.size() / 3),
                         static_cast<int>(vn.size() / 3),
                         static_cast<int>(vt.size() / 2), &vi)) {
          if (err) {
            (*err) = "Failed parse `f' line(e.g. zero value for face index).\n";
          }
          return false;
        }

        face.push_back(vi);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      // replace with emplace_back + std::move on C++11
      faceGroup.push_back(std::vector<vertex_index>());
      faceGroup[faceGroup.size() - 1].swap(face);

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      if (material_map.find(namebuf) != material_map.end()) {
        newMaterialId = material_map[namebuf];
      } else {
        // { error!! material not found }
      }

      if (newMaterialId != material) {
        // Create per-face material. Thus we don't add `shape` to `shapes` at
        // this time.
        // just clear `faceGroup` after `exportFaceGroupToShape()` call.
        exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                               triangulate);
        faceGroup.clear();
        material = newMaterialId;
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (err) {
            (*err) +=
                "WARN: Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), materials,
                                   &material_map, &err_mtl);
            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;  // This should be warn message.
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (err) {
              (*err) +=
                  "WARN: Failed to load material file(s). Use default "
                  "material.\n";
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      // flush previous face group.
      bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                        triangulate);
      (void)ret;  // return value not used.

      if (shape.mesh.indices.size() > 0) {
        shapes->push_back(shape);
      }

      shape = shape_t();

      // material = -1;
      faceGroup.clear();

      std::vector<std::string> names;
      names.reserve(2);

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      // names[0] must be 'g', so skip the 0th element.
      if (names.size() > 1) {
        name = names[1];
      } else {
        name = "";
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // flush previous face group.
      bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                        triangulate);
      if (ret) {
        shapes->push_back(shape);
      }

      // material = -1;
      faceGroup.clear();
      shape = shape_t();

      // @todo { multiple object name? }
      token += 2;
      std::stringstream ss;
      ss << token;
      name = ss.str();

      continue;
    }

    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;

      tag.name = parseString(&token);

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = parseInt(&token);
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        tag.stringValues[i] = parseString(&token);
      }

      tags.push_back(tag);
    }

    // Ignore unknown command.
  }

  bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                    triangulate);
  // exportFaceGroupToShape return false when `usemtl` is called in the last
  // line.
  // we also add `shape` to `shapes` when `shape.mesh` has already some
  // faces(indices)
  if (ret || shape.mesh.indices.size()) {
    shapes->push_back(shape);
  }
  faceGroup.clear();  // for safety

  if (err) {
    (*err) += errss.str();
  }

  attrib->vertices.swap(v);
  attrib->normals.swap(vn);
  attrib->texcoords.swap(vt);
  attrib->colors.swap(vc);

  return true;
}